

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O0

FUNCTION_RETURN generate_disk_pc_id(PcIdentifier *identifiers,uint *num_identifiers,_Bool use_label)

{
  uint uVar1;
  FUNCTION_RETURN FVar2;
  DiskInfo *diskInfos_00;
  undefined4 *puVar3;
  uchar local_5c;
  DiskInfo *diskInfos;
  uint uStack_44;
  char firstChar;
  int defined_identifiers;
  uint j;
  uint i;
  FUNCTION_RETURN result_diskinfos;
  size_t available_disk_info;
  size_t disk_num;
  uint *puStack_20;
  _Bool use_label_local;
  uint *num_identifiers_local;
  PcIdentifier *identifiers_local;
  
  _i = 0;
  disk_num._7_1_ = use_label;
  puStack_20 = num_identifiers;
  num_identifiers_local = (uint *)identifiers;
  identifiers_local._4_4_ = getDiskInfos((DiskInfo *)0x0,&available_disk_info);
  if (identifiers_local._4_4_ == FUNC_RET_OK) {
    diskInfos_00 = (DiskInfo *)malloc(available_disk_info * 0x20c);
    memset(diskInfos_00,0,available_disk_info * 0x20c);
    FVar2 = getDiskInfos(diskInfos_00,&available_disk_info);
    if (FVar2 == FUNC_RET_OK) {
      for (defined_identifiers = 0; (uint)defined_identifiers < available_disk_info;
          defined_identifiers = defined_identifiers + 1) {
        if ((disk_num._7_1_ & 1) == 0) {
          local_5c = diskInfos_00[(uint)defined_identifiers].disk_sn[0];
        }
        else {
          local_5c = diskInfos_00[(uint)defined_identifiers].label[0];
        }
        _i = (long)(int)(uint)(local_5c != '\0') + _i;
      }
      uVar1 = *puStack_20;
      *puStack_20 = (uint)_i;
      if (num_identifiers_local == (uint *)0x0) {
        free(diskInfos_00);
        identifiers_local._4_4_ = FUNC_RET_OK;
      }
      else if ((ulong)(long)(int)uVar1 < _i) {
        free(diskInfos_00);
        identifiers_local._4_4_ = FUNC_RET_BUFFER_TOO_SMALL;
      }
      else {
        uStack_44 = 0;
        for (defined_identifiers = 0; (uint)defined_identifiers < available_disk_info;
            defined_identifiers = defined_identifiers + 1) {
          if ((disk_num._7_1_ & 1) == 0) {
            if (diskInfos_00[(uint)defined_identifiers].disk_sn[0] != '\0') {
              puVar3 = (undefined4 *)((long)num_identifiers_local + (ulong)uStack_44 * 6);
              *puVar3 = *(undefined4 *)(diskInfos_00[(uint)defined_identifiers].disk_sn + 2);
              *(undefined2 *)(puVar3 + 1) =
                   *(undefined2 *)(diskInfos_00[(uint)defined_identifiers].disk_sn + 6);
              uStack_44 = uStack_44 + 1;
            }
          }
          else if (diskInfos_00[(uint)defined_identifiers].label[0] != '\0') {
            memset((void *)((long)num_identifiers_local + (ulong)uStack_44 * 6),0,6);
            strncpy((char *)((long)num_identifiers_local + (ulong)uStack_44 * 6),
                    diskInfos_00[(uint)defined_identifiers].label,6);
            uStack_44 = uStack_44 + 1;
          }
        }
        free(diskInfos_00);
        identifiers_local._4_4_ = FUNC_RET_OK;
      }
    }
    else {
      free(diskInfos_00);
      identifiers_local._4_4_ = FVar2;
    }
  }
  return identifiers_local._4_4_;
}

Assistant:

static FUNCTION_RETURN generate_disk_pc_id(PcIdentifier * identifiers,
		unsigned int * num_identifiers, bool use_label) {
	size_t disk_num, available_disk_info = 0;
	FUNCTION_RETURN result_diskinfos;
	unsigned int i, j;
	int defined_identifiers;
	char firstChar;
	DiskInfo * diskInfos;

	result_diskinfos = getDiskInfos(NULL, &disk_num);
	if (result_diskinfos != FUNC_RET_OK) {
		return result_diskinfos;
	}
	diskInfos = (DiskInfo*) malloc(disk_num * sizeof(DiskInfo));
	memset(diskInfos,0,disk_num * sizeof(DiskInfo));
	result_diskinfos = getDiskInfos(diskInfos, &disk_num);
	if (result_diskinfos != FUNC_RET_OK) {
		free(diskInfos);
		return result_diskinfos;
	}
	for (i = 0; i < disk_num; i++) {
		firstChar = use_label ? diskInfos[i].label[0] : diskInfos[i].disk_sn[0];
		available_disk_info += firstChar == 0 ? 0 : 1;
	}

	defined_identifiers = *num_identifiers;
	*num_identifiers = available_disk_info;
	if (identifiers == NULL) {
		free(diskInfos);
		return FUNC_RET_OK;
	} else if (available_disk_info > defined_identifiers) {
		free(diskInfos);
		return FUNC_RET_BUFFER_TOO_SMALL;
	}

	j = 0;
	for (i = 0; i < disk_num; i++) {
		if (use_label) {
			if (diskInfos[i].label[0] != 0) {
				memset(identifiers[j], 0, sizeof(PcIdentifier)); //!!!!!!!
				strncpy((char*)identifiers[j], diskInfos[i].label,
						sizeof(PcIdentifier));
				j++;
			}
		} else {
			if (diskInfos[i].disk_sn[0] != 0) {
				memcpy(identifiers[j], &diskInfos[i].disk_sn[2],
						sizeof(PcIdentifier));
				j++;
			}
		}
	}
	free(diskInfos);
	return FUNC_RET_OK;
}